

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  RemoveConst<kj::CidrRange> *pRVar1;
  NetworkFilter *pNVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  sockaddr *in_RCX;
  uint uVar7;
  CidrRange *cidr;
  CidrRange *pCVar8;
  ArrayPtr<const_char> AVar9;
  ArrayPtr<const_kj::CidrRange> AVar10;
  ArrayPtr<const_kj::CidrRange> cidrs;
  ArrayPtr<const_kj::CidrRange> cidrs_00;
  ArrayPtr<const_kj::CidrRange> cidrs_01;
  ArrayPtr<const_kj::CidrRange> cidrs_02;
  ArrayPtr<const_kj::CidrRange> cidrs_03;
  long lStackY_80;
  uint addrlen_local;
  Fault f;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  
  _kjCondition.left = &addrlen_local;
  _kjCondition.result = addrlen >= 2;
  _kjCondition.right = 2;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  addrlen_local = addrlen;
  if (addrlen < 2) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xc39,FAILED,"addrlen >= sizeof(addr->sa_family)","_kjCondition,",&_kjCondition);
    Debug::Fault::fatal(&f);
  }
  if (addr->sa_family == 1) {
    AVar9 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar9.size_ == 0) || (*AVar9.ptr != '\0')) {
      lStackY_80 = 0x48;
    }
    else {
      lStackY_80 = 0x49;
    }
    return (bool)*(undefined1 *)
                  ((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lStackY_80);
  }
  if ((this->allowPublic == true) && ((addr->sa_family | 8) == 10)) {
    AVar10 = privateCidrs();
    cidrs.size_ = (size_t)addr;
    cidrs.ptr = (CidrRange *)AVar10.size_;
    bVar3 = matchesAny((_ *)AVar10.ptr,cidrs,in_RCX);
    if (!bVar3) {
      AVar10 = localCidrs();
      cidrs_00.size_ = (size_t)addr;
      cidrs_00.ptr = (CidrRange *)AVar10.size_;
      bVar3 = matchesAny((_ *)AVar10.ptr,cidrs_00,in_RCX);
      if (!bVar3) {
        AVar10 = reservedCidrs();
        cidrs_03.size_ = (size_t)addr;
        cidrs_03.ptr = (CidrRange *)AVar10.size_;
        bVar3 = matchesAny((_ *)AVar10.ptr,cidrs_03,in_RCX);
        bVar3 = !bVar3;
        goto LAB_003c5f05;
      }
    }
  }
  bVar3 = false;
LAB_003c5f05:
  if ((this->allowNetwork == true) && ((addr->sa_family | 8) == 10)) {
    AVar10 = localCidrs();
    cidrs_01.size_ = (size_t)addr;
    cidrs_01.ptr = (CidrRange *)AVar10.size_;
    bVar4 = matchesAny((_ *)AVar10.ptr,cidrs_01,in_RCX);
    if (!bVar4) {
      AVar10 = reservedCidrs();
      cidrs_02.size_ = (size_t)addr;
      cidrs_02.ptr = (CidrRange *)AVar10.size_;
      bVar4 = matchesAny((_ *)AVar10.ptr,cidrs_02,in_RCX);
      bVar3 = (bool)(bVar3 | !bVar4);
    }
  }
  pRVar1 = (this->allowCidrs).builder.pos;
  uVar7 = 0;
  for (pCVar8 = (this->allowCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
    bVar4 = CidrRange::matches(pCVar8,addr);
    if (bVar4) {
      if (uVar7 <= pCVar8->bitCount) {
        uVar7 = pCVar8->bitCount;
      }
      bVar3 = true;
    }
  }
  if (bVar3) {
    pRVar1 = (this->denyCidrs).builder.pos;
    for (pCVar8 = (this->denyCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
      bVar3 = CidrRange::matches(pCVar8,addr);
      if ((bVar3) && (uVar7 <= pCVar8->bitCount)) goto LAB_003c5fa7;
    }
    pNVar2 = (this->next).ptr;
    if (pNVar2 == (NetworkFilter *)0x0) {
      uVar5 = 1;
    }
    else {
      iVar6 = (**(pNVar2->super_NetworkFilter)._vptr_NetworkFilter)
                        (pNVar2,addr,(ulong)addrlen_local);
      uVar5 = (undefined1)iVar6;
    }
  }
  else {
LAB_003c5fa7:
    uVar5 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;

  if (allowPublic) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(privateCidrs(), addr) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  if (allowNetwork) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_SOME(n, next) {
    return n.shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}